

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,GeomMesh *mesh,uint32_t indent,
          bool closing_brace)

{
  tinyusdz *ptVar1;
  undefined8 uVar2;
  bool bVar3;
  ostream *poVar4;
  value_type *pvVar5;
  value_type *pvVar6;
  _Rb_tree_node_base *p_Var7;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t uVar8;
  uint32_t n_02;
  FamilyType v;
  uint32_t n_03;
  undefined7 in_register_00000081;
  string *name;
  uint32_t in_R9D;
  uint indent_00;
  string attr_name;
  stringstream ss;
  allocator local_281;
  string local_280;
  undefined1 local_260 [32];
  storage_t<tinyusdz::value::StringData> local_240;
  pprint *local_210;
  undefined1 local_208 [16];
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  name = (string *)CONCAT71(in_register_00000081,closing_brace);
  local_240._36_4_ = indent;
  local_208._0_8_ = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_280,(pprint *)((ulong)mesh & 0xffffffff),n);
  poVar4 = ::std::operator<<(local_1a8,(string *)&local_280);
  to_string_abi_cxx11_((string *)local_260,(tinyusdz *)(ulong)*(uint *)(this + 0xa98),s);
  poVar4 = ::std::operator<<(poVar4,(string *)local_260);
  poVar4 = ::std::operator<<(poVar4," Mesh \"");
  poVar4 = ::std::operator<<(poVar4,(string *)(this + 0xa78));
  ::std::operator<<(poVar4,"\"\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  local_240._40_8_ = this;
  bVar3 = PrimMetas::authored((PrimMetas *)(this + 0x1a10));
  uVar8 = n_00;
  if (bVar3) {
    pprint::Indent_abi_cxx11_(&local_280,(pprint *)((ulong)mesh & 0xffffffff),n_00);
    poVar4 = ::std::operator<<(local_1a8,(string *)&local_280);
    ::std::operator<<(poVar4,"(\n");
    ::std::__cxx11::string::_M_dispose();
    print_prim_metas_abi_cxx11_(&local_280,this + 0x1a10,(PrimMeta *)(ulong)((int)mesh + 1),indent);
    ::std::operator<<(local_1a8,(string *)&local_280);
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_(&local_280,(pprint *)((ulong)mesh & 0xffffffff),n_01);
    poVar4 = ::std::operator<<(local_1a8,(string *)&local_280);
    ::std::operator<<(poVar4,")\n");
    ::std::__cxx11::string::_M_dispose();
    uVar8 = extraout_EDX;
  }
  indent_00 = (int)mesh + 1;
  local_210 = (pprint *)((ulong)mesh & 0xffffffff);
  pprint::Indent_abi_cxx11_(&local_280,(pprint *)((ulong)mesh & 0xffffffff),uVar8);
  poVar4 = ::std::operator<<(local_1a8,(string *)&local_280);
  ::std::operator<<(poVar4,"{\n");
  ::std::__cxx11::string::_M_dispose();
  uVar2 = local_240._40_8_;
  ptVar1 = (tinyusdz *)(local_240._40_8_ + 0x1e68);
  ::std::__cxx11::string::string((string *)local_260,"points",(allocator *)(local_260 + 0x20));
  print_typed_attr<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
            (&local_280,ptVar1,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
              *)local_260,(string *)(ulong)indent_00,(uint32_t)name);
  ::std::operator<<(local_1a8,(string *)&local_280);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_260,"normals",(allocator *)(local_260 + 0x20));
  print_typed_attr<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
            (&local_280,(tinyusdz *)(uVar2 + 0x20e0),
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
              *)local_260,(string *)(ulong)indent_00,(uint32_t)name);
  ::std::operator<<(local_1a8,(string *)&local_280);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string
            ((string *)local_260,"faceVertexIndices",(allocator *)(local_260 + 0x20));
  print_typed_attr<std::vector<int,std::allocator<int>>>
            (&local_280,(tinyusdz *)(uVar2 + 0x2848),
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             local_260,(string *)(ulong)indent_00,(uint32_t)name);
  ::std::operator<<(local_1a8,(string *)&local_280);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string
            ((string *)local_260,"faceVertexCounts",(allocator *)(local_260 + 0x20));
  print_typed_attr<std::vector<int,std::allocator<int>>>
            (&local_280,(tinyusdz *)(uVar2 + 0x25d0),
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             local_260,(string *)(ulong)indent_00,(uint32_t)name);
  ::std::operator<<(local_1a8,(string *)&local_280);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  if (*(tinyusdz *)(uVar2 + 0x2ac0) == (tinyusdz)0x1) {
    pvVar5 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                       ((optional<tinyusdz::Relationship> *)(uVar2 + 0x2ac0));
    pvVar6 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                       ((optional<tinyusdz::Relationship> *)(uVar2 + 0x2ac0));
    local_240._0_4_ = pvVar6->listOpQual;
    ::std::__cxx11::string::string
              ((string *)local_260,"skel:skeleton",(allocator *)(local_208 + 0x10));
    name = (string *)(ulong)indent_00;
    anon_unknown_173::print_relationship
              (&local_280,pvVar5,(ListEditQual *)(local_260 + 0x20),SUB81((string *)local_260,0),
               name,in_R9D);
    ::std::operator<<(local_1a8,(string *)&local_280);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::string::string
            ((string *)local_260,"skel:blendShapes",(allocator *)(local_260 + 0x20));
  print_typed_attr<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
            (&local_280,(tinyusdz *)(uVar2 + 0x43e8),
             (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
             local_260,(string *)(ulong)indent_00,(uint32_t)name);
  ::std::operator<<(local_1a8,(string *)&local_280);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  if (*(tinyusdz *)(uVar2 + 0x4638) == (tinyusdz)0x1) {
    pvVar5 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                       ((optional<tinyusdz::Relationship> *)(uVar2 + 0x4638));
    pvVar6 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                       ((optional<tinyusdz::Relationship> *)(uVar2 + 0x4638));
    local_240._0_4_ = pvVar6->listOpQual;
    ::std::__cxx11::string::string
              ((string *)local_260,"skel:blendShapeTargets",(allocator *)(local_208 + 0x10));
    name = (string *)(ulong)indent_00;
    anon_unknown_173::print_relationship
              (&local_280,pvVar5,(ListEditQual *)(local_260 + 0x20),SUB81((string *)local_260,0),
               name,in_R9D);
    ::std::operator<<(local_1a8,(string *)&local_280);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  local_208._8_8_ = uVar2 + 0x4950;
  for (p_Var7 = *(_Rb_tree_node_base **)(uVar2 + 0x4960); uVar2 = local_240._40_8_,
      uVar8 = (uint32_t)name, p_Var7 != (_Rb_tree_node_base *)local_208._8_8_;
      p_Var7 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var7)) {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                     "subsetFamily:",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var7 + 1));
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_280
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260
                     ,":familyType");
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
               (pprint *)(ulong)indent_00,n_02);
    poVar4 = ::std::operator<<(local_1a8,(string *)local_260);
    poVar4 = ::std::operator<<(poVar4,"uniform token ");
    poVar4 = ::std::operator<<(poVar4,(string *)&local_280);
    poVar4 = ::std::operator<<(poVar4," = ");
    to_string_abi_cxx11_((string *)(local_208 + 0x10),(tinyusdz *)(ulong)p_Var7[2]._M_color,v);
    ::std::__cxx11::string::string((string *)&local_1d8,"\"",&local_281);
    quote((string *)(local_260 + 0x20),(string *)(local_208 + 0x10),&local_1d8);
    poVar4 = ::std::operator<<(poVar4,(string *)(local_260 + 0x20));
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  ptVar1 = (tinyusdz *)(local_240._40_8_ + 0x2dd0);
  ::std::__cxx11::string::string
            ((string *)local_260,"cornerIndices",(allocator *)(local_260 + 0x20));
  print_typed_attr<std::vector<int,std::allocator<int>>>
            (&local_280,ptVar1,
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             local_260,(string *)(ulong)indent_00,uVar8);
  ::std::operator<<(local_1a8,(string *)&local_280);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string
            ((string *)local_260,"cornerSharpnesses",(allocator *)(local_260 + 0x20));
  print_typed_attr<std::vector<float,std::allocator<float>>>
            (&local_280,(tinyusdz *)(uVar2 + 0x3048),
             (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_> *)
             local_260,(string *)(ulong)indent_00,uVar8);
  ::std::operator<<(local_1a8,(string *)&local_280);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string
            ((string *)local_260,"creaseIndices",(allocator *)(local_260 + 0x20));
  print_typed_attr<std::vector<int,std::allocator<int>>>
            (&local_280,(tinyusdz *)(uVar2 + 0x32c0),
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             local_260,(string *)(ulong)indent_00,uVar8);
  ::std::operator<<(local_1a8,(string *)&local_280);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string
            ((string *)local_260,"creaseLengths",(allocator *)(local_260 + 0x20));
  print_typed_attr<std::vector<int,std::allocator<int>>>
            (&local_280,(tinyusdz *)(uVar2 + 0x3538),
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             local_260,(string *)(ulong)indent_00,uVar8);
  ::std::operator<<(local_1a8,(string *)&local_280);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string
            ((string *)local_260,"creaseSharpnesses",(allocator *)(local_260 + 0x20));
  print_typed_attr<std::vector<float,std::allocator<float>>>
            (&local_280,(tinyusdz *)(uVar2 + 0x37b0),
             (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_> *)
             local_260,(string *)(ulong)indent_00,uVar8);
  ::std::operator<<(local_1a8,(string *)&local_280);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_260,"holeIndices",(allocator *)(local_260 + 0x20));
  print_typed_attr<std::vector<int,std::allocator<int>>>
            (&local_280,(tinyusdz *)(uVar2 + 0x3a28),
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             local_260,(string *)(ulong)indent_00,uVar8);
  ::std::operator<<(local_1a8,(string *)&local_280);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string
            ((string *)local_260,"subdivisonScheme",(allocator *)(local_260 + 0x20));
  print_typed_token_attr<tinyusdz::GeomMesh::SubdivisionScheme>
            (&local_280,
             (TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme> *)(uVar2 + 0x3f28),
             (string *)local_260,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_280);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string
            ((string *)local_260,"interpolateBoundary",(allocator *)(local_260 + 0x20));
  print_typed_token_attr<tinyusdz::GeomMesh::InterpolateBoundary>
            (&local_280,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_>
              *)(uVar2 + 0x3ca0),(string *)local_260,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_280);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string
            ((string *)local_260,"faceVaryingLinearInterpolation",(allocator *)(local_260 + 0x20));
  print_typed_token_attr<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>
            (&local_280,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>_>
              *)(uVar2 + 0x4160),(string *)local_260,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_280);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  print_gprim_predefined<tinyusdz::GeomMesh>(&local_280,(GeomMesh *)uVar2,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_280);
  ::std::__cxx11::string::_M_dispose();
  print_props(&local_280,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(uVar2 + 0x1970),indent_00);
  ::std::operator<<(local_1a8,(string *)&local_280);
  ::std::__cxx11::string::_M_dispose();
  if (local_240._36_1_ != '\0') {
    pprint::Indent_abi_cxx11_(&local_280,local_210,n_03);
    poVar4 = ::std::operator<<(local_1a8,(string *)&local_280);
    ::std::operator<<(poVar4,"}\n");
    ::std::__cxx11::string::_M_dispose();
  }
  uVar2 = local_208._0_8_;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return (string *)(anon_struct_8_0_00000001_for___align)uVar2;
}

Assistant:

std::string to_string(const GeomMesh &mesh, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(mesh.spec) << " Mesh \""
     << mesh.name << "\"\n";
  if (mesh.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(mesh.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  // members
  ss << print_typed_attr(mesh.points, "points", indent + 1);
  ss << print_typed_attr(mesh.normals, "normals", indent + 1);
  ss << print_typed_attr(mesh.faceVertexIndices, "faceVertexIndices",
                         indent + 1);
  ss << print_typed_attr(mesh.faceVertexCounts, "faceVertexCounts", indent + 1);

  if (mesh.skeleton) {
    ss << print_relationship(mesh.skeleton.value(),
                             mesh.skeleton.value().get_listedit_qual(),
                             /* custom */ false, "skel:skeleton", indent + 1);
  }

  ss << print_typed_attr(mesh.blendShapes, "skel:blendShapes", indent + 1);
  if (mesh.blendShapeTargets) {
    ss << print_relationship(mesh.blendShapeTargets.value(),
                             mesh.blendShapeTargets.value().get_listedit_qual(),
                             /* custom */ false, "skel:blendShapeTargets",
                             indent + 1);
  }

  for (const auto &item : mesh.subsetFamilyTypeMap) {
    std::string attr_name = "subsetFamily:" + item.first.str() + ":familyType";
    // TODO: Support connection attr?
    ss << pprint::Indent(indent+1) << "uniform token " << attr_name << " = " << quote(to_string(item.second)) << "\n";
  }

  // subdiv
  ss << print_typed_attr(mesh.cornerIndices, "cornerIndices", indent + 1);
  ss << print_typed_attr(mesh.cornerSharpnesses, "cornerSharpnesses",
                         indent + 1);
  ss << print_typed_attr(mesh.creaseIndices, "creaseIndices", indent + 1);
  ss << print_typed_attr(mesh.creaseLengths, "creaseLengths", indent + 1);
  ss << print_typed_attr(mesh.creaseSharpnesses, "creaseSharpnesses",
                         indent + 1);
  ss << print_typed_attr(mesh.holeIndices, "holeIndices", indent + 1);

  ss << print_typed_token_attr(mesh.subdivisionScheme, "subdivisonScheme",
                               indent + 1);
  ss << print_typed_token_attr(mesh.interpolateBoundary, "interpolateBoundary",
                               indent + 1);
  ss << print_typed_token_attr(mesh.faceVaryingLinearInterpolation,
                               "faceVaryingLinearInterpolation", indent + 1);

  ss << print_gprim_predefined(mesh, indent + 1);

#if 0
  // GeomSubset.
  for (const auto &subset : mesh.geom_subset_children) {
    ss << to_string(subset, indent + 1, /* closing_brace */ true);
  }
#endif

  ss << print_props(mesh.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}